

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void wasm::RemoveUnusedBrs::visitAny(RemoveUnusedBrs *self,Expression **currp)

{
  Expression *pEVar1;
  value_type ppEVar2;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this;
  bool bVar3;
  Flows *this_00;
  Break *pBVar4;
  If *pIVar5;
  reference pvVar6;
  reference pppEVar7;
  size_type sVar8;
  reference pppEVar9;
  size_t sVar10;
  Expression **ppEVar11;
  Switch *curr_00;
  bool local_109;
  bool local_f9;
  bool local_e2;
  Switch *sw;
  size_t sStack_d0;
  Index i_1;
  size_t size;
  Break *flow_1;
  int local_b8;
  Index i;
  Index skip;
  Index size_1;
  ExpressionList *list;
  Name name;
  Block *block;
  Expression **flow;
  iterator __end6;
  iterator __begin6;
  type *__range6;
  BasicType local_5c;
  undefined1 local_58 [8];
  type ifTrueFlows;
  If *iff;
  Break *br;
  Flows *flows;
  Expression *curr;
  Expression **currp_local;
  RemoveUnusedBrs *self_local;
  
  pEVar1 = *currp;
  this_00 = &self->flows;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  bVar3 = Expression::is<wasm::Break>(pEVar1);
  if (bVar3) {
    std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::clear(this_00);
    pBVar4 = Expression::cast<wasm::Break>(pEVar1);
    if (pBVar4->condition == (Expression *)0x0) {
      std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
                (this_00,(value_type *)&curr);
    }
    else {
      stopValueFlow((RemoveUnusedBrs *)currp_local);
    }
  }
  else {
    bVar3 = Expression::is<wasm::Return>(pEVar1);
    if (bVar3) {
      std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::clear(this_00);
      std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
                (this_00,(value_type *)&curr);
    }
    else {
      bVar3 = Expression::is<wasm::If>(pEVar1);
      if (bVar3) {
        pIVar5 = Expression::cast<wasm::If>(pEVar1);
        ifTrueFlows.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        bVar3 = wasm::Type::operator==
                          (&pIVar5->condition->type,
                           (BasicType *)
                           ((long)&ifTrueFlows.
                                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        if (bVar3) {
          stopFlow((RemoveUnusedBrs *)currp_local);
        }
        else if (pIVar5->ifFalse == (Expression *)0x0) {
          stopValueFlow((RemoveUnusedBrs *)currp_local);
        }
        else {
          sVar8 = std::
                  vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                  ::size((vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                          *)(currp_local + 0x2a));
          if (sVar8 == 0) {
            __assert_fail("self->ifStack.size() > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                          ,0xc4,
                          "static void wasm::RemoveUnusedBrs::visitAny(RemoveUnusedBrs *, Expression **)"
                         );
          }
          pvVar6 = std::
                   vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                   ::back((vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                           *)(currp_local + 0x2a));
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector
                    ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_58,
                     pvVar6);
          std::
          vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
          ::pop_back((vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                      *)(currp_local + 0x2a));
          local_5c = none;
          bVar3 = wasm::Type::operator==(&pIVar5->ifTrue->type,&local_5c);
          local_e2 = true;
          if (!bVar3) {
            __range6._0_4_ = 0;
            local_e2 = wasm::Type::operator==(&pIVar5->ifFalse->type,(BasicType *)&__range6);
          }
          if (local_e2 != false) {
            removeValueFlow((RemoveUnusedBrs *)currp_local,(Flows *)local_58);
            stopValueFlow((RemoveUnusedBrs *)currp_local);
          }
          __end6 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                             ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                              local_58);
          flow = (Expression **)
                 std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                           ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                            local_58);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                             *)&flow), bVar3) {
            pppEVar7 = __gnu_cxx::
                       __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                       ::operator*(&__end6);
            block = (Block *)*pppEVar7;
            std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
                      (this_00,(value_type *)&block);
            __gnu_cxx::
            __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
            ::operator++(&__end6);
          }
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~vector
                    ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_58);
        }
      }
      else {
        name.super_IString.str._M_str = (char *)Expression::dynCast<wasm::Block>(pEVar1);
        if ((Block *)name.super_IString.str._M_str == (Block *)0x0) {
          bVar3 = Expression::is<wasm::Nop>(pEVar1);
          if (bVar3) {
            stopValueFlow((RemoveUnusedBrs *)currp_local);
          }
          else {
            bVar3 = Expression::is<wasm::Loop>(pEVar1);
            if ((!bVar3) && (bVar3 = Expression::is<wasm::TryTable>(pEVar1), !bVar3)) {
              curr_00 = Expression::dynCast<wasm::Switch>(pEVar1);
              if (curr_00 == (Switch *)0x0) {
                stopFlow((RemoveUnusedBrs *)currp_local);
              }
              else {
                stopFlow((RemoveUnusedBrs *)currp_local);
                optimizeSwitch((RemoveUnusedBrs *)currp_local,curr_00);
              }
            }
          }
        }
        else {
          list = (ExpressionList *)
                 (((Block *)name.super_IString.str._M_str)->name).super_IString.str._M_len;
          name.super_IString.str._M_len =
               (size_t)(((Block *)name.super_IString.str._M_str)->name).super_IString.str._M_str;
          _skip = &(((Block *)name.super_IString.str._M_str)->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
          bVar3 = IString::is((IString *)&list);
          if (bVar3) {
            sVar8 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::size
                              (this_00);
            i = (Index)sVar8;
            local_b8 = 0;
            for (flow_1._4_4_ = 0; flow_1._4_4_ < i; flow_1._4_4_ = flow_1._4_4_ + 1) {
              pppEVar9 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
                         operator[](this_00,(ulong)flow_1._4_4_);
              size = (size_t)Expression::dynCast<wasm::Break>(**pppEVar9);
              if (((Break *)size == (Break *)0x0) ||
                 (bVar3 = IString::operator==(&(((Break *)size)->name).super_IString,
                                              (IString *)&list), !bVar3)) {
                if (local_b8 != 0) {
                  pppEVar9 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ::operator[](this_00,(ulong)flow_1._4_4_);
                  ppEVar2 = *pppEVar9;
                  pppEVar9 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ::operator[](this_00,(ulong)(flow_1._4_4_ - local_b8));
                  *pppEVar9 = ppEVar2;
                }
              }
              else {
                if (*(long *)(size + 0x20) == 0) {
                  ExpressionManipulator::nop<wasm::Break>((Break *)size);
                }
                else {
                  pEVar1 = *(Expression **)(size + 0x20);
                  pppEVar9 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ::operator[](this_00,(ulong)flow_1._4_4_);
                  **pppEVar9 = pEVar1;
                }
                local_b8 = local_b8 + 1;
                *(undefined1 *)(currp_local + 0x26) = 1;
              }
            }
            if (local_b8 != 0) {
              std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::resize
                        (this_00,(ulong)(i - local_b8));
            }
          }
          while( true ) {
            sVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                               (_skip);
            local_f9 = false;
            if (sVar10 != 0) {
              ppEVar11 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                   (_skip);
              local_f9 = Expression::is<wasm::Nop>(*ppEVar11);
            }
            this = _skip;
            if (local_f9 == false) break;
            sVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                               (_skip);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                      (this,sVar10 - 1);
            *(undefined1 *)(currp_local + 0x26) = 1;
          }
          sStack_d0 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (_skip);
          for (sw._4_4_ = 0; sw._4_4_ < sStack_d0; sw._4_4_ = sw._4_4_ + 1) {
            local_109 = false;
            if ((ulong)sw._4_4_ != sStack_d0 - 1) {
              ppEVar11 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         operator[](_skip,(ulong)sw._4_4_);
              sw._0_4_ = 1;
              local_109 = wasm::Type::operator==(&(*ppEVar11)->type,(BasicType *)&sw);
            }
            if (local_109 != false) {
              stopValueFlow((RemoveUnusedBrs *)currp_local);
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void visitAny(RemoveUnusedBrs* self, Expression** currp) {
    auto* curr = *currp;
    auto& flows = self->flows;

    if (curr->is<Break>()) {
      flows.clear();
      auto* br = curr->cast<Break>();
      if (!br->condition) { // TODO: optimize?
        // a break, let's see where it flows to
        flows.push_back(currp);
      } else {
        self->stopValueFlow();
      }
    } else if (curr->is<Return>()) {
      flows.clear();
      flows.push_back(currp);
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (iff->condition->type == Type::unreachable) {
        // avoid trying to optimize this, we never reach it anyhow
        self->stopFlow();
        return;
      }
      if (iff->ifFalse) {
        assert(self->ifStack.size() > 0);
        auto ifTrueFlows = std::move(self->ifStack.back());
        self->ifStack.pop_back();
        // we can flow values out in most cases, except if one arm
        // has the none type - we will update the types later, but
        // there is no way to emit a proper type for one arm being
        // none and the other flowing a value; and there is no way
        // to flow a value from a none.
        if (iff->ifTrue->type == Type::none ||
            iff->ifFalse->type == Type::none) {
          self->removeValueFlow(ifTrueFlows);
          self->stopValueFlow();
        }
        for (auto* flow : ifTrueFlows) {
          flows.push_back(flow);
        }
      } else {
        // if without else stops the flow of values
        self->stopValueFlow();
      }
    } else if (auto* block = curr->dynCast<Block>()) {
      // any breaks flowing to here are unnecessary, as we get here anyhow
      auto name = block->name;
      auto& list = block->list;
      if (name.is()) {
        Index size = flows.size();
        Index skip = 0;
        for (Index i = 0; i < size; i++) {
          auto* flow = (*flows[i])->dynCast<Break>();
          if (flow && flow->name == name) {
            if (!flow->value) {
              // br => nop
              ExpressionManipulator::nop<Break>(flow);
            } else {
              // br with value => value
              *flows[i] = flow->value;
            }
            skip++;
            self->anotherCycle = true;
          } else if (skip > 0) {
            flows[i - skip] = flows[i];
          }
        }
        if (skip > 0) {
          flows.resize(size - skip);
        }
      }
      // Drop a nop at the end of a block, which prevents a value flowing. Note
      // that this is worth doing regardless of whether we have a name on this
      // block or not (which the if right above us checks) - such a nop is
      // always unneeded and can limit later optimizations.
      while (list.size() > 0 && list.back()->is<Nop>()) {
        list.resize(list.size() - 1);
        self->anotherCycle = true;
      }
      // A value flowing is only valid if it is a value that the block actually
      // flows out. If it is never reached, it does not flow out, and may be
      // invalid to represent as such.
      auto size = list.size();
      for (Index i = 0; i < size; i++) {
        if (i != size - 1 && list[i]->type == Type::unreachable) {
          // No value flows out of this block.
          self->stopValueFlow();
          break;
        }
      }
    } else if (curr->is<Nop>()) {
      // Ignore (could be result of a previous cycle).
      self->stopValueFlow();
    } else if (curr->is<Loop>() || curr->is<TryTable>()) {
      // Do nothing - it's ok for values to flow out.
      // TODO: Legacy Try as well?
    } else if (auto* sw = curr->dynCast<Switch>()) {
      self->stopFlow();
      self->optimizeSwitch(sw);
    } else {
      // Anything else stops the flow.
      self->stopFlow();
    }
  }